

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config,string *objectFileName)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  pointer ppVar5;
  string *psVar6;
  string *args_1;
  string *args_3;
  cmMakefile *pcVar7;
  cmLocalNinjaGenerator *pcVar8;
  pointer this_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool local_731;
  byte local_6a9;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_> local_618;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  RuleVariables compileObjectVars;
  string local_4b0;
  undefined1 local_490 [8];
  string flag;
  string local_430;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_410;
  basic_string_view<char,_std::char_traits<char>_> local_400;
  basic_string_view<char,_std::char_traits<char>_> local_3f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3e0;
  cmFileSet *local_3d0;
  cmFileSet *fs;
  string local_3a8;
  string local_388;
  string local_368;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_348;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_340;
  iterator pchIt;
  string pchOptions;
  string local_310;
  cmValue local_2f0;
  string local_2e8;
  cmValue local_2c8;
  cmValue coptions;
  undefined1 local_2b8 [8];
  string COMPILE_OPTIONS;
  cmValue local_278;
  cmValue cflags;
  undefined1 local_268 [8];
  string COMPILE_FLAGS;
  string local_228;
  undefined1 local_208 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  undefined1 local_120 [8];
  string pchSource;
  string *arch;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string filterArch;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pchSources;
  string *objectFileName_local;
  string *config_local;
  string *language_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *flags;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&architectures.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_b0,language);
  cmGeneratorTarget::GetAppleArchs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88,pcVar1,config,&local_b0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_b0);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_88);
  }
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88);
  arch = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arch), bVar2) {
    pchSource.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    cmGeneratorTarget::GetPchSource
              ((string *)local_120,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
               language,(string *)pchSource.field_2._8_8_);
    psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_120,psVar6);
    if (_Var3) {
      std::__cxx11::string::operator=((string *)&__range1,(string *)pchSource.field_2._8_8_);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::make_pair<std::__cxx11::string_const&,std::__cxx11::string_const&>
                (&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 pchSource.field_2._8_8_);
      std::
      unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&architectures.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_160);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_160);
    }
    std::__cxx11::string::~string((string *)local_120);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cmGeneratorTarget::AddExplicitLanguageFlags
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,__return_storage_ptr__,source);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  }
  cmCommonTargetGenerator::GetFlags
            ((string *)((long)&genexInterpreter.Language.field_2 + 8),
             &this->super_cmCommonTargetGenerator,language,config,(string *)&__range1);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             (string *)(genexInterpreter.Language.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(genexInterpreter.Language.field_2._M_local_buf + 8));
  bVar2 = std::operator==(language,"Fortran");
  if (bVar2) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
    cmCommonTargetGenerator::AppendFortranPreprocessFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source,NO);
  }
  pcVar8 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_228,(string *)config);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string
            ((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8),(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_208,(cmLocalGenerator *)pcVar8,&local_228,
             pcVar1,(string *)((long)&COMPILE_FLAGS.field_2 + 8));
  std::__cxx11::string::~string((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,"COMPILE_FLAGS",(allocator<char> *)((long)&cflags.Value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cflags.Value + 7));
  local_278 = cmSourceFile::GetProperty(source,(string *)local_268);
  bVar2 = cmValue::operator_cast_to_bool(&local_278);
  if (bVar2) {
    pcVar8 = this->LocalGenerator;
    psVar6 = cmValue::operator*[abi_cxx11_(&local_278);
    std::__cxx11::string::string
              ((string *)(COMPILE_OPTIONS.field_2._M_local_buf + 8),(string *)psVar6);
    psVar6 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_208,
                        (string *)((long)&COMPILE_OPTIONS.field_2 + 8),(string *)local_268);
    (*(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[7])(pcVar8,__return_storage_ptr__,psVar6);
    std::__cxx11::string::~string((string *)(COMPILE_OPTIONS.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,"COMPILE_OPTIONS",(allocator<char> *)((long)&coptions.Value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&coptions.Value + 7));
  local_2c8 = cmSourceFile::GetProperty(source,(string *)local_2b8);
  bVar2 = cmValue::operator_cast_to_bool(&local_2c8);
  if (bVar2) {
    pcVar8 = this->LocalGenerator;
    psVar6 = cmValue::operator*[abi_cxx11_(&local_2c8);
    std::__cxx11::string::string((string *)&local_2e8,(string *)psVar6);
    psVar6 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_208,&local_2e8,(string *)local_2b8
                       );
    cmLocalGenerator::AppendCompileOptions
              ((cmLocalGenerator *)pcVar8,__return_storage_ptr__,psVar6,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  bVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&architectures.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pchOptions.field_2._M_local_buf[0xe] = '\0';
  pchOptions.field_2._M_local_buf[0xd] = '\0';
  local_6a9 = 0;
  if (!bVar2) {
    std::allocator<char>::allocator();
    pchOptions.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"SKIP_PRECOMPILE_HEADERS",
               (allocator<char> *)(pchOptions.field_2._M_local_buf + 0xf));
    pchOptions.field_2._M_local_buf[0xd] = '\x01';
    local_2f0 = cmSourceFile::GetProperty(source,&local_310);
    bVar2 = cmValue::operator_cast_to_bool(&local_2f0);
    local_6a9 = bVar2 ^ 0xff;
  }
  if ((pchOptions.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_310);
  }
  if ((pchOptions.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(pchOptions.field_2._M_local_buf + 0xf));
  }
  if ((local_6a9 & 1) != 0) {
    std::__cxx11::string::string((string *)&pchIt);
    psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    local_340._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&architectures.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar6);
    local_348._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&architectures.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::__detail::operator!=(&local_340,&local_348);
    if (bVar2) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)&local_340);
      cmGeneratorTarget::GetPchCreateCompileOptions
                (&local_368,pcVar1,config,language,&ppVar5->second);
      std::__cxx11::string::operator=((string *)&pchIt,(string *)&local_368);
      std::__cxx11::string::~string((string *)&local_368);
    }
    else {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string((string *)&local_3a8);
      cmGeneratorTarget::GetPchUseCompileOptions(&local_388,pcVar1,config,language,&local_3a8);
      std::__cxx11::string::operator=((string *)&pchIt,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
    }
    pcVar8 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&fs,(string *)&pchIt);
    psVar6 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_208,(string *)&fs,
                        (string *)local_2b8);
    cmLocalGenerator::AppendCompileOptions
              ((cmLocalGenerator *)pcVar8,__return_storage_ptr__,psVar6,(char *)0x0);
    std::__cxx11::string::~string((string *)&fs);
    std::__cxx11::string::~string((string *)&pchIt);
  }
  local_3d0 = cmGeneratorTarget::GetFileSetForSource
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,config,source);
  local_731 = false;
  if (local_3d0 != (cmFileSet *)0x0) {
    psVar6 = cmFileSet::GetType_abi_cxx11_(local_3d0);
    local_3e0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    local_400 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("CXX_MODULES",0xb);
    local_3f0 = local_400;
    local_731 = std::operator==(local_3e0,local_400);
  }
  if (local_731 != false) {
    cmSourceFile::GetLanguage_abi_cxx11_(&local_430,source);
    local_410 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_430);
    __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CXX",3);
    bVar2 = std::operator!=(local_410,__y);
    std::__cxx11::string::~string((string *)&local_430);
    if (bVar2) {
      pcVar7 = GetMakefile(this);
      psVar6 = cmTarget::GetName_abi_cxx11_
                         (((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
      args_1 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      args_3 = cmFileSet::GetType_abi_cxx11_(local_3d0);
      cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[25],std::__cxx11::string_const&,char_const(&)[25],std::__cxx11::string_const&,char_const(&)[54]>
                ((string *)((long)&flag.field_2 + 8),(char (*) [9])0xfe8cbd,psVar6,
                 (char (*) [25])"\" contains the source\n  ",args_1,
                 (char (*) [25])"\nin a file set of type \"",args_3,
                 (char (*) [54])"\" but the source is not classified as a \"CXX\" source.");
      cmMakefile::IssueMessage(pcVar7,FATAL_ERROR,(string *)((long)&flag.field_2 + 8));
      std::__cxx11::string::~string((string *)(flag.field_2._M_local_buf + 8));
    }
    bVar2 = cmTarget::IsNormal(((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
    if (!bVar2) {
      pcVar7 = GetMakefile(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"CMAKE_CXX_MODULE_BMI_ONLY_FLAG",
                 (allocator<char> *)((long)&compileObjectVars.Launcher + 7));
      psVar6 = cmMakefile::GetSafeDefinition(pcVar7,&local_4b0);
      std::__cxx11::string::string((string *)local_490,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&compileObjectVars.Launcher + 7));
      cmRulePlaceholderExpander::RuleVariables::RuleVariables
                ((RuleVariables *)&rulePlaceholderExpander);
      compileObjectVars.Output = (char *)std::__cxx11::string::c_str();
      pcVar8 = GetLocalGenerator(this);
      (*(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
        _vptr_cmOutputConverter[6])(&local_618);
      this_00 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->(&local_618);
      pcVar8 = GetLocalGenerator(this);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_00,(cmOutputConverter *)pcVar8,(string *)local_490,
                 (RuleVariables *)&rulePlaceholderExpander);
      cmLocalGenerator::AppendCompileOptions
                ((cmLocalGenerator *)this->LocalGenerator,__return_storage_ptr__,(string *)local_490
                 ,(char *)0x0);
      std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
      ~unique_ptr(&local_618);
      std::__cxx11::string::~string((string *)local_490);
    }
  }
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)local_268);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_208);
  std::__cxx11::string::~string((string *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&architectures.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language,
  const std::string& config, const std::string& objectFileName)
{
  std::unordered_map<std::string, std::string> pchSources;
  std::vector<std::string> architectures =
    this->GeneratorTarget->GetAppleArchs(config, language);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::string filterArch;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);
    if (pchSource == source->GetFullPath()) {
      filterArch = arch;
    }
    if (!pchSource.empty()) {
      pchSources.insert(std::make_pair(pchSource, arch));
    }
  }

  std::string flags;
  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  this->GeneratorTarget->AddExplicitLanguageFlags(flags, *source);

  if (!flags.empty()) {
    flags += " ";
  }
  flags += this->GetFlags(language, config, filterArch);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
    this->AppendFortranPreprocessFlags(flags, *source,
                                       PreprocessFlagsRequired::NO);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  // Add precompile headers compile options.
  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    std::string pchOptions;
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      pchOptions = this->GeneratorTarget->GetPchCreateCompileOptions(
        config, language, pchIt->second);
    } else {
      pchOptions =
        this->GeneratorTarget->GetPchUseCompileOptions(config, language);
    }

    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(pchOptions, COMPILE_OPTIONS));
  }

  auto const* fs = this->GeneratorTarget->GetFileSetForSource(config, source);
  if (fs && fs->GetType() == "CXX_MODULES"_s) {
    if (source->GetLanguage() != "CXX"_s) {
      this->GetMakefile()->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Target \"", this->GeneratorTarget->Target->GetName(),
                 "\" contains the source\n  ", source->GetFullPath(),
                 "\nin a file set of type \"", fs->GetType(),
                 R"(" but the source is not classified as a "CXX" source.)"));
    }

    if (!this->GeneratorTarget->Target->IsNormal()) {
      auto flag = this->GetMakefile()->GetSafeDefinition(
        "CMAKE_CXX_MODULE_BMI_ONLY_FLAG");
      cmRulePlaceholderExpander::RuleVariables compileObjectVars;
      compileObjectVars.Object = objectFileName.c_str();
      auto rulePlaceholderExpander =
        this->GetLocalGenerator()->CreateRulePlaceholderExpander();
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   flag, compileObjectVars);
      this->LocalGenerator->AppendCompileOptions(flags, flag);
    }
  }

  return flags;
}